

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O0

_Bool Curl_pipeline_site_blacklisted(Curl_easy *handle,connectdata *conn)

{
  void *pvVar1;
  int iVar2;
  curl_llist *pcVar3;
  site_blacklist_entry *site;
  curl_llist_element *curr;
  curl_llist *blacklist;
  connectdata *conn_local;
  Curl_easy *handle_local;
  
  if ((handle->multi != (Curl_multi *)0x0) &&
     (pcVar3 = Curl_multi_pipelining_site_bl(handle->multi), pcVar3 != (curl_llist *)0x0)) {
    for (site = (site_blacklist_entry *)pcVar3->head; site != (site_blacklist_entry *)0x0;
        site = (site_blacklist_entry *)(site->list).next) {
      pvVar1 = (site->list).ptr;
      iVar2 = Curl_strcasecompare((char *)((long)pvVar1 + 0x1a),(conn->host).name);
      if ((iVar2 != 0) && ((uint)*(ushort *)((long)pvVar1 + 0x18) == conn->remote_port)) {
        Curl_infof(handle,"Site %s:%d is pipeline blacklisted\n",(conn->host).name,
                   (ulong)(uint)conn->remote_port);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Curl_pipeline_site_blacklisted(struct Curl_easy *handle,
                                    struct connectdata *conn)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_site_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        struct site_blacklist_entry *site;

        site = curr->ptr;
        if(strcasecompare(site->hostname, conn->host.name) &&
           site->port == conn->remote_port) {
          infof(handle, "Site %s:%d is pipeline blacklisted\n",
                conn->host.name, conn->remote_port);
          return TRUE;
        }
        curr = curr->next;
      }
    }
  }
  return FALSE;
}